

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O1

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  int iVar2;
  int iVar3;
  jpeg_c_coef_controller *pjVar4;
  long lVar5;
  boolean bVar6;
  JBLOCKARRAY ppaJVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  JBLOCKROW paJVar12;
  long lVar13;
  long lVar14;
  JBLOCKARRAY buffer [4];
  long local_68;
  long alStack_58 [5];
  
  pjVar4 = cinfo->coef;
  if (0 < cinfo->comps_in_scan) {
    lVar14 = 0;
    do {
      JVar1 = cinfo->cur_comp_info[lVar14]->v_samp_factor;
      ppaJVar7 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)
                            (&pjVar4[7].start_pass)[cinfo->cur_comp_info[lVar14]->component_index],
                            *(int *)&pjVar4[1].start_pass * JVar1,JVar1,0);
      alStack_58[lVar14] = (long)ppaJVar7;
      lVar14 = lVar14 + 1;
    } while (lVar14 < cinfo->comps_in_scan);
  }
  local_68 = (long)*(int *)&pjVar4[1].compress_data;
  if (*(int *)&pjVar4[1].compress_data < *(int *)((long)&pjVar4[1].compress_data + 4)) {
    do {
      uVar9 = *(uint *)((long)&pjVar4[1].start_pass + 4);
      if (uVar9 < cinfo->MCUs_per_row) {
        do {
          iVar2 = cinfo->comps_in_scan;
          if (0 < (long)iVar2) {
            lVar14 = 0;
            iVar8 = 0;
            do {
              lVar10 = (long)cinfo->cur_comp_info[lVar14]->MCU_height;
              if (0 < lVar10) {
                iVar3 = cinfo->cur_comp_info[lVar14]->MCU_width;
                lVar5 = alStack_58[lVar14];
                lVar11 = 0;
                do {
                  if (0 < iVar3) {
                    paJVar12 = (JBLOCKROW)
                               (*(long *)(lVar5 + local_68 * 8 + lVar11 * 8) +
                               (ulong)(iVar3 * uVar9) * 0x80);
                    lVar13 = 0;
                    do {
                      (&pjVar4[2].start_pass)[iVar8 + lVar13] =
                           (_func_void_j_compress_ptr_J_BUF_MODE *)paJVar12;
                      paJVar12 = paJVar12 + 1;
                      lVar13 = lVar13 + 1;
                    } while (iVar3 != (int)lVar13);
                    iVar8 = iVar8 + (int)lVar13;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != lVar10);
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 != iVar2);
          }
          bVar6 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)(pjVar4 + 2));
          if (bVar6 == 0) {
            *(int *)&pjVar4[1].compress_data = (int)local_68;
            *(uint *)((long)&pjVar4[1].start_pass + 4) = uVar9;
            return 0;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < cinfo->MCUs_per_row);
      }
      *(undefined4 *)((long)&pjVar4[1].start_pass + 4) = 0;
      local_68 = local_68 + 1;
    } while (local_68 < *(int *)((long)&pjVar4[1].compress_data + 4));
  }
  *(int *)&pjVar4[1].start_pass = *(int *)&pjVar4[1].start_pass + 1;
  start_iMCU_row(cinfo);
  return 1;
}

Assistant:

METHODDEF(boolean)
compress_output(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, blockcnt;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW MCU_buffer[C_MAX_BLOCKS_IN_MCU];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
         MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;                 /* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        start_col = MCU_col_num * compptr->MCU_width;
        blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width :
                                                  compptr->last_col_width;
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          if (coef->iMCU_row_num < last_iMCU_row ||
              yindex + yoffset < compptr->last_row_height) {
            /* Fill in pointers to real blocks in this row */
            buffer_ptr = buffer[ci][yindex + yoffset] + start_col;
            for (xindex = 0; xindex < blockcnt; xindex++)
              MCU_buffer[blkn++] = buffer_ptr++;
          } else {
            /* At bottom of image, need a whole row of dummy blocks */
            xindex = 0;
          }
          /* Fill in any dummy blocks needed in this row.
           * Dummy blocks are filled in the same way as in jccoefct.c:
           * all zeroes in the AC entries, DC entries equal to previous
           * block's DC value.  The init routine has already zeroed the
           * AC entries, so we need only set the DC entries correctly.
           */
          for (; xindex < compptr->MCU_width; xindex++) {
            MCU_buffer[blkn] = coef->dummy_buffer[blkn];
            MCU_buffer[blkn][0][0] = MCU_buffer[blkn - 1][0][0];
            blkn++;
          }
        }
      }
      /* Try to write the MCU. */
      if (!(*cinfo->entropy->encode_mcu) (cinfo, MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->mcu_ctr = MCU_col_num;
        return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}